

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
PlatformIdNode::Evaluate
          (string *__return_storage_ptr__,PlatformIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmMakefile *this_00;
  pointer pbVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  char *pcVar5;
  char *pcVar6;
  pointer pbVar7;
  bool bVar8;
  string local_48;
  
  this_00 = context->LG->Makefile;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_SYSTEM_NAME","");
  psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pbVar7 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 == pbVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar4->_M_string_length);
  }
  else {
    __n = psVar4->_M_string_length;
    if (__n == 0) {
      bVar8 = pbVar7->_M_string_length == 0;
      pcVar6 = "0";
      if (bVar8) {
        pcVar6 = "1";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "";
      if (bVar8) {
        pcVar5 = "";
      }
    }
    else {
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      do {
        if ((pbVar7->_M_string_length == __n) &&
           (iVar3 = bcmp((pbVar7->_M_dataplus)._M_p,pcVar2,__n), iVar3 == 0)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar6 = "1";
          pcVar5 = "";
          goto LAB_004fd0b1;
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar1);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "0";
      pcVar5 = "";
    }
LAB_004fd0b1:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* /*content*/,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& platformId =
      context->LG->GetMakefile()->GetSafeDefinition("CMAKE_SYSTEM_NAME");
    if (parameters.empty()) {
      return platformId;
    }

    if (platformId.empty()) {
      return parameters.front().empty() ? "1" : "0";
    }

    for (auto const& param : parameters) {
      if (param == platformId) {
        return "1";
      }
    }
    return "0";
  }